

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velodyne.h
# Opt level: O1

int ProcessRawDataVelodyne
              (VELODYNE *pVelodyne,u_char *data,uint32_t data_len,double *pDistances,double *pAngles
              ,double *pElevation)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  u_char *puVar5;
  u_char *puVar6;
  int iVar7;
  int j;
  long lVar8;
  double dVar9;
  double dVar10;
  bool local_65;
  
  puVar6 = data + 5;
  uVar4 = 0;
  local_65 = true;
  iVar7 = 0;
  do {
    uVar3 = *(ushort *)(data + uVar4 * 100) << 8 | *(ushort *)(data + uVar4 * 100) >> 8;
    if (uVar3 == 0xffee) {
      uVar1 = *(ushort *)(data + uVar4 * 100 + 2);
      lVar8 = 0;
      puVar5 = puVar6;
      do {
        uVar2 = (uint)lVar8 & 0xf;
        dVar9 = ((double)*(ushort *)(puVar5 + -1) + (double)*(ushort *)(puVar5 + -1)) / 1000.0;
        if (uVar2 == pVelodyne->DefaultLaserID) {
          dVar10 = fmod((((double)uVar2 * pVelodyne->step_elevation + pVelodyne->min_elevation) *
                        3.141592653589793) / 180.0,6.283185307179586);
          dVar10 = fmod(dVar10 + 9.42477796076938,6.283185307179586);
          *pElevation = dVar10 + -3.141592653589793;
          dVar10 = fmod((((double)uVar1 / 100.0) * 3.141592653589793) / 180.0,6.283185307179586);
          dVar10 = fmod(dVar10 + 6.283185307179586,6.283185307179586);
          pAngles[iVar7] = dVar10;
          if (pVelodyne->bDistanceProjectionWithElevation != 0) {
            dVar10 = cos(*pElevation);
            dVar9 = dVar9 * dVar10;
          }
          pDistances[iVar7] = dVar9;
          iVar7 = iVar7 + 1;
        }
        lVar8 = lVar8 + 1;
        puVar5 = puVar5 + 3;
      } while (lVar8 != 0x20);
    }
    else {
      puts("Error reading data from a Velodyne : Invalid data packet. ");
    }
    if (uVar3 != 0xffee) break;
    local_65 = uVar4 < 0xb;
    uVar4 = uVar4 + 1;
    puVar6 = puVar6 + 100;
  } while (uVar4 != 0xc);
  return (uint)local_65;
}

Assistant:

int ProcessRawDataVelodyne(VELODYNE* pVelodyne, const u_char* data, uint32_t data_len, double* pDistances, double* pAngles, double* pElevation)
{
	int k = 0;

	// Assuming buffer contains the received UDP packet.
	unsigned char* dataPacket = (unsigned char*)data;

	// Parse the data packet.
	unsigned char productID = dataPacket[data_len-1];
	unsigned char returnMode = dataPacket[data_len-2];
	unsigned int timeStamp = (dataPacket[data_len-3] << 24) | (dataPacket[data_len-4] << 16) | (dataPacket[data_len-5] << 8) | dataPacket[data_len-6];

	//if (productID != 0x22) {
	//	printf("Error reading data from a Velodyne : Unsupported productID. \n");
	//	return EXIT_FAILURE;
	//}

	int dual_mode = (returnMode == 0x39);
	//if (dual_mode) {
	//	printf("Error reading data from a Velodyne : Unsupported mode. \n");
	//	return EXIT_FAILURE;
	//}

	//memset(pAngles, 0, NB_MEASUREMENTS_VELODYNE);
	//memset(pDistances, 0, NB_MEASUREMENTS_VELODYNE);
	for (int i = 0; i < 12; i++) { // 12 blocks in one data packet.
		unsigned short flag = (dataPacket[i*100] << 8) | dataPacket[i*100 + 1]; // Each block starts with a flag.
		if (flag != 0xFFEE) {
			printf("Error reading data from a Velodyne : Invalid data packet. \n");
			return EXIT_FAILURE;
		}
		unsigned short rawAzimuth = (dataPacket[i*100 + 3] << 8) | dataPacket[i*100 + 2]; // Followed by azimuth data.
		double azimuth = rawAzimuth / 100.0; // Convert to degrees.

		for (int j = 0; j < 32; j++) { // Each block contains 32 data points.
			int dataBlockIndex = (dual_mode)? (i - (i % 2)) + (j / 16): (i * 2) + (j / 16); // From documentation.
			int laserID = j % 16; // There are 16 lasers

			// Assuming firing alternance, symetry...
			double elevation = pVelodyne->min_elevation+(laserID*pVelodyne->step_elevation);

			unsigned short rawDistance = (dataPacket[i*100 + 5 + j*3] << 8) | dataPacket[i*100 + 4 + j*3]; // Distance data.
			//if (rawDistance == 0) // Invalid data.
			//	continue;

			double distance = ((double)rawDistance)*2.0 / 1000.0; // Convert to meters.
			unsigned char intensity = dataPacket[i*100 + 6 + j*3]; // Intensity data.

			double timeOffset = (55.296 * dataBlockIndex) + (2.304 * laserID); // From documentation.

			//std::cout << "Laser ID: " << laserID << "Elevation: " << elevation << ", Azimuth: " << azimuth << ", Distance: " << distance << ", Intensity: " << int(intensity) << ", TimeStamp: " << std::fixed << timeStamp+timeOffset << std::endl;
			

			// TODO: there is a concept of "Vertical Correction" that should be applied...


			if (laserID == pVelodyne->DefaultLaserID)
			{
				*pElevation = fmod_2PI_deg2rad(elevation); // Convert in rad.
				pAngles[k] = fmod_2PI_pos_deg2rad(azimuth); // Convert in rad.
				if (pVelodyne->bDistanceProjectionWithElevation)
				{
					pDistances[k] = distance*cos(*pElevation); // Convert in m.
				}
				else 
				{
					pDistances[k] = distance; // Convert in m.
				}
				k++;
			}
			UNREFERENCED_PARAMETER(intensity);
			UNREFERENCED_PARAMETER(timeOffset);
		}
	}

	UNREFERENCED_PARAMETER(timeStamp);
	UNREFERENCED_PARAMETER(productID);

	return EXIT_SUCCESS;	
}